

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::interpreter::impl::handle_new_expression
          (value *__return_storage_ptr__,impl *this,expression *e)

{
  int iVar1;
  expression *e_00;
  expression_list *es;
  source_extend *pos;
  wostringstream woss;
  not_callable_exception *anon_var_0;
  auto_stack_update asu;
  value local_e0;
  vector<mjs::value,_std::allocator<mjs::value>_> local_b8;
  value local_a0;
  call_expression *local_78;
  call_expression *ce;
  undefined1 local_60 [8];
  vector<mjs::value,_std::allocator<mjs::value>_> args;
  value o;
  expression *e_local;
  impl *this_local;
  
  value::value((value *)&args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
            ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_60);
  iVar1 = (*(e->super_syntax_node)._vptr_syntax_node[3])();
  if (iVar1 == 6) {
    local_78 = (call_expression *)e;
    e_00 = call_expression::member((call_expression *)e);
    eval(&local_a0,this,e_00);
    value::operator=((value *)&args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_a0);
    value::~value(&local_a0);
    es = call_expression::arguments(local_78);
    eval_argument_list(&local_b8,this,es);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::operator=
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_60,&local_b8);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_b8);
  }
  else {
    eval(&local_e0,this,e);
    value::operator=((value *)&args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_e0);
    value::~value(&local_e0);
  }
  get_value((value *)&asu.pos_.start,this,
            (value *)&args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  value::operator=((value *)&args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (value *)&asu.pos_.start);
  value::~value((value *)&asu.pos_.start);
  pos = syntax_node::extend(&e->super_syntax_node);
  auto_stack_update::auto_stack_update((auto_stack_update *)&anon_var_0,this,pos);
  construct_function(__return_storage_ptr__,
                     (value *)&args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (value *)value::undefined,
                     (vector<mjs::value,_std::allocator<mjs::value>_> *)local_60);
  auto_stack_update::~auto_stack_update((auto_stack_update *)&anon_var_0);
  std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
            ((vector<mjs::value,_std::allocator<mjs::value>_> *)local_60);
  value::~value((value *)&args.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

value handle_new_expression(const expression& e) {
        value o;
        std::vector<value> args;
        if (e.type() == expression_type::call) {
            const auto& ce = static_cast<const call_expression&>(e);
            o = eval(ce.member());
            args = eval_argument_list(ce.arguments());
        } else {
            o = eval(e);
        }
        o = get_value(o);
        try {
            auto_stack_update asu{*this, e.extend()};
            return construct_function(o, value::undefined, args);
        } catch (const not_callable_exception&) {
            std::wostringstream woss;
            if (o.type() != value_type::object) {
                woss << to_string(heap_, o).view() << " is not an object";
            } else {
                // TODO: Could get function name here at some point
                woss << o.object_value()->class_name().view() << " is not constructable";
            }            
            throw native_error_exception(native_error_type::type, stack_trace(), woss.str());
        }
    }